

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  char *pcVar1;
  byte *pbVar2;
  sqlite3_index_orderby *psVar3;
  byte bVar4;
  byte bVar5;
  u8 uVar6;
  ushort uVar7;
  ushort uVar8;
  WhereInfo *pWVar9;
  WhereClause *pWVar10;
  Parse *pParse;
  SrcList *pSVar11;
  WhereLoop *p;
  ExprList *pEVar12;
  Table *pTVar13;
  Expr *pEVar14;
  Index *pIVar15;
  bool bVar16;
  int iVar17;
  char *pcVar18;
  sqlite3_index_info *pIdxInfo;
  WhereClause *pWVar19;
  char *pcVar20;
  sqlite3_uint64 sVar21;
  uint uVar22;
  Expr *pEVar23;
  ulong uVar24;
  ulong uVar25;
  ushort uVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  Bitmask *pBVar30;
  Index **ppIVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  ulong uVar35;
  anon_union_8_3_bb5b150a_for_u *paVar36;
  sqlite3_index_constraint *psVar37;
  long lVar38;
  long lVar39;
  u16 mNoOmit;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  long in_FS_OFFSET;
  bool bVar43;
  int local_d0;
  long local_c8;
  ulong local_b8;
  int bRetry;
  int bIn;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bIn = -0x55555556;
  bRetry = 0;
  pWVar9 = pBuilder->pWInfo;
  pWVar10 = pBuilder->pWC;
  pParse = pWVar9->pParse;
  pSVar11 = pWVar9->pTabList;
  p = pBuilder->pNew;
  bVar4 = p->iTab;
  pEVar12 = pWVar9->pOrderBy;
  pTVar13 = pSVar11->a[bVar4].pSTab;
  local_d0 = 0;
  if (pWVar10 == (WhereClause *)0x0) {
    local_c8 = 0;
  }
  else {
    iVar17 = 0;
    pWVar19 = pWVar10;
    do {
      iVar27 = pWVar19->nTerm;
      if (0 < iVar27) {
        iVar29 = pSVar11->a[bVar4].iCursor;
        pBVar30 = &pWVar19->a->prereqRight;
        do {
          uVar7 = *(u16 *)((long)pBVar30 + -0x16);
          *(ushort *)((long)pBVar30 + -0x16) = uVar7 & 0xffbf;
          if (((*(int *)((long)pBVar30 + -0xc) == iVar29) && ((*pBVar30 & mUnusable) == 0)) &&
             (-1 < (char)uVar7 && (*pBVar30 & 0xf7ff00000000) != 0)) {
            bVar5 = pSVar11->a[bVar4].fg.jointype;
            if ((bVar5 & 0x58) != 0) {
              uVar40 = ((WhereTerm *)(pBVar30 + -5))->pExpr->flags;
              if ((((uVar40 & 3) == 0) ||
                  ((((WhereTerm *)(pBVar30 + -5))->pExpr->w).iJoin != iVar29)) ||
                 (((bVar5 & 0x18) != 0 && ((uVar40 & 2) != 0)))) goto LAB_0019a716;
            }
            iVar17 = iVar17 + 1;
            *(ushort *)((long)pBVar30 + -0x16) = uVar7 | 0x40;
          }
LAB_0019a716:
          pBVar30 = pBVar30 + 7;
          iVar27 = iVar27 + -1;
        } while (iVar27 != 0);
      }
      pWVar19 = pWVar19->pOuter;
    } while (pWVar19 != (WhereClause *)0x0);
    local_c8 = (long)iVar17;
  }
  uVar40 = 0;
  if (pEVar12 != (ExprList *)0x0) {
    iVar17 = pEVar12->nExpr;
    local_d0 = 0;
    lVar38 = 0;
    if ((long)iVar17 < 1) {
LAB_0019a8f6:
      uVar40 = 0;
      if ((int)lVar38 != iVar17) goto LAB_0019a935;
    }
    else {
      lVar38 = 0;
      do {
        pEVar23 = pEVar12->a[lVar38].pExpr;
        local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.walkerDepth = -0x55555556;
        local_68.eCode = 1;
        local_68.mWFlags = 0xaaaa;
        local_68.pParse = (Parse *)0x0;
        local_68.xExprCallback = exprNodeIsConstant;
        local_68.xSelectCallback = sqlite3SelectWalkFail;
        if (pEVar23 != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pEVar23);
          if (local_68.eCode == 0) {
            if ((pEVar12->a[lVar38].fg.sortFlags & 2) != 0) goto LAB_0019a8f6;
            if (pEVar23->op == 'r') {
              pEVar14 = pEVar23->pLeft;
              if ((pEVar14->op != 0xa8) || (pEVar14->iTable != pSVar11->a[bVar4].iCursor))
              goto LAB_0019a8f6;
              lVar39 = (long)pEVar14->iColumn;
              pEVar23->iColumn = pEVar14->iColumn;
              if (-1 < lVar39) {
                uVar7 = pTVar13->aCol[lVar39].colFlags;
                if ((uVar7 >> 9 & 1) == 0) {
                  pcVar18 = (char *)0x0;
                }
                else {
                  pcVar18 = pTVar13->aCol[lVar39].zCnName + -1;
                  do {
                    pcVar20 = pcVar18 + 1;
                    pcVar18 = pcVar18 + 1;
                  } while (*pcVar20 != '\0');
                  pcVar20 = pcVar18;
                  if ((uVar7 & 4) != 0) {
                    do {
                      pcVar18 = pcVar20 + 1;
                      pcVar1 = pcVar20 + 1;
                      pcVar20 = pcVar18;
                    } while (*pcVar1 != '\0');
                  }
                  pcVar18 = pcVar18 + 1;
                }
                if ((pEVar23->u).zToken != (char *)0x0) {
                  if (pcVar18 == (char *)0x0) {
                    pcVar18 = "BINARY";
                  }
                  lVar39 = 0;
                  do {
                    bVar5 = (pEVar23->u).zToken[lVar39];
                    if (bVar5 == pcVar18[lVar39]) {
                      if ((ulong)bVar5 == 0) goto LAB_0019a8e8;
                    }
                    else if (""[bVar5] != ""[(byte)pcVar18[lVar39]]) break;
                    lVar39 = lVar39 + 1;
                  } while( true );
                }
                goto LAB_0019a8f6;
              }
            }
            else if ((pEVar23->op != 0xa8) || (pEVar23->iTable != pSVar11->a[bVar4].iCursor))
            goto LAB_0019a8f6;
          }
        }
LAB_0019a8e8:
        lVar38 = lVar38 + 1;
      } while (lVar38 != iVar17);
    }
    uVar7 = pWVar9->wctrlFlags;
    local_d0 = iVar17;
    if (((char)uVar7 < '\0') && (-1 < *(short *)&pSVar11->a[bVar4].fg.field_0x1)) {
      uVar40 = uVar7 >> 9 & 1 | 2;
    }
    else {
      uVar40 = uVar7 >> 6 & 1;
    }
  }
LAB_0019a935:
  lVar38 = (long)local_d0;
  pIdxInfo = (sqlite3_index_info *)
             sqlite3DbMallocZero(pParse->db,lVar38 * 8 + local_c8 * 0x1c + 0x88);
  if (pIdxInfo == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar3 = (sqlite3_index_orderby *)((long)&pIdxInfo[1].aConstraintUsage + local_c8 * 0x14);
    pIdxInfo->aConstraint = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + local_c8);
    pIdxInfo->aOrderBy = psVar3;
    pIdxInfo->aConstraintUsage = (sqlite3_index_constraint_usage *)(psVar3 + lVar38);
    sVar21 = pSVar11->a[bVar4].colUsed;
    pIdxInfo->colUsed = sVar21;
    if ((pTVar13->tabFlags & 0x80) != 0) {
      ppIVar31 = &pTVar13->pIndex;
      do {
        pIVar15 = *ppIVar31;
        ppIVar31 = &pIVar15->pNext;
      } while ((*(ushort *)&pIVar15->field_0x63 & 3) != 2);
      if ((ulong)pIVar15->nKeyCol != 0) {
        uVar32 = 0;
        do {
          uVar42 = (ulong)(ushort)pIVar15->aiColumn[uVar32];
          if (0x3e < pIVar15->aiColumn[uVar32]) {
            uVar42 = 0x3f;
          }
          sVar21 = sVar21 | 1L << (uVar42 & 0x3f);
          uVar32 = uVar32 + 1;
        } while (pIVar15->nKeyCol != uVar32);
        pIdxInfo->colUsed = sVar21;
      }
    }
    iVar17 = 0;
    *(WhereClause **)(pIdxInfo + 1) = pWVar10;
    pIdxInfo[1].aConstraint = (sqlite3_index_constraint *)pParse;
    pIdxInfo[1].nOrderBy = uVar40;
    *(undefined4 *)&pIdxInfo[1].field_0x14 = 0;
    if (pWVar10 == (WhereClause *)0x0) {
      mNoOmit = 0;
      iVar27 = 0;
    }
    else {
      uVar40 = 0;
      iVar29 = 0;
      iVar27 = 0;
      uVar41 = 0;
      pWVar19 = pWVar10;
      do {
        if (0 < pWVar19->nTerm) {
          iVar34 = pWVar19->nTerm + iVar29;
          paVar36 = &pWVar19->a->u;
          do {
            uVar7 = *(u16 *)((long)paVar36 + -0xe);
            if ((uVar7 & 0x40) != 0) {
              psVar37 = (sqlite3_index_constraint *)(&pIdxInfo[1].aConstraintUsage + local_c8) +
                        iVar27;
              psVar37->iColumn = (paVar36->x).leftColumn;
              psVar37->iTermOffset = iVar29;
              uVar8 = *(u16 *)((long)paVar36 + -0xc);
              uVar26 = uVar8 & 0x3fff;
              if (uVar26 == 1) {
                if (-1 < (short)uVar7) {
                  uVar22 = 1 << ((byte)iVar27 & 0x1f);
                  if (0x1f < iVar27) {
                    uVar22 = 0;
                  }
                  uVar40 = uVar40 | uVar22;
                  *(uint *)&pIdxInfo[1].field_0x14 = uVar40;
                }
                psVar37->op = '\x02';
              }
              else if (uVar26 == 0x40) {
                psVar37->op = *(u8 *)((long)paVar36 + -9);
              }
              else if ((uVar8 & 0x180) == 0) {
                psVar37->op = (uchar)uVar8;
                if ((uVar8 & 0x3c) != 0) {
                  pEVar23 = ((WhereTerm *)(paVar36 + -4))->pExpr->pRight;
                  uVar6 = pEVar23->op;
                  if (uVar6 == 0xb0) {
                    uVar6 = pEVar23->op2;
                  }
                  if (uVar6 != 0xb1) {
                    if (uVar6 != 0x8b) goto LAB_0019ab4d;
                    pEVar23 = (Expr *)(pEVar23->x).pList;
                  }
                  if (1 < ((pEVar23->x).pList)->nExpr) {
                    uVar22 = 1 << ((byte)iVar27 & 0x1f);
                    if (0xf < iVar27) {
                      uVar22 = 0;
                    }
                    uVar41 = uVar41 | uVar22;
                    if (uVar26 == 4) {
                      psVar37->op = ' ';
                    }
                    else if (uVar26 == 0x10) {
                      psVar37->op = '\b';
                    }
                  }
                }
              }
              else if (uVar26 == 0x100) {
                psVar37->op = 'G';
              }
              else {
                psVar37->op = 'H';
              }
LAB_0019ab4d:
              iVar27 = iVar27 + 1;
            }
            iVar29 = iVar29 + 1;
            paVar36 = paVar36 + 7;
          } while (iVar29 < iVar34);
        }
        mNoOmit = (u16)uVar41;
        pWVar19 = pWVar19->pOuter;
      } while (pWVar19 != (WhereClause *)0x0);
    }
    pIdxInfo->nConstraint = iVar27;
    if (0 < local_d0) {
      lVar39 = 0;
      iVar17 = 0;
      do {
        pEVar23 = *(Expr **)((long)&pEVar12->a[0].pExpr + lVar39);
        local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.walkerDepth = -0x55555556;
        local_68.eCode = 1;
        local_68.mWFlags = 0xaaaa;
        local_68.pParse = (Parse *)0x0;
        local_68.xExprCallback = exprNodeIsConstant;
        local_68.xSelectCallback = sqlite3SelectWalkFail;
        if (pEVar23 != (Expr *)0x0) {
          sqlite3WalkExprNN(&local_68,pEVar23);
          if (local_68.eCode == 0) {
            psVar3[iVar17].iColumn = (int)pEVar23->iColumn;
            *(byte *)((long)&pIdxInfo[1].aConstraintUsage + (long)iVar17 * 8 + local_c8 * 0x14 + 4)
                 = (&pEVar12->a[0].fg.sortFlags)[lVar39] & 1;
            iVar17 = iVar17 + 1;
          }
        }
        lVar39 = lVar39 + 0x18;
      } while (lVar38 * 0x18 != lVar39);
    }
    pIdxInfo->nOrderBy = iVar17;
    p->rSetup = 0;
    p->wsFlags = 0x400;
    p->nLTerm = 0;
    pbVar2 = (byte *)((long)&p->u + 4);
    *pbVar2 = *pbVar2 & 0xfe;
    uVar40 = pIdxInfo->nConstraint;
    iVar17 = whereLoopResize(pParse->db,p,uVar40);
    if (iVar17 == 0) {
      iVar17 = whereLoopAddVirtualOne
                         (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,&bRetry);
      if (bRetry != 0) {
        iVar17 = whereLoopAddVirtualOne
                           (pBuilder,mPrereq,0xffffffffffffffff,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
      }
      if (iVar17 == 0) {
        uVar42 = ~mPrereq;
        uVar32 = p->prereq & uVar42;
        iVar17 = 0;
        if (bIn != 0 || uVar32 != 0) {
          if (bIn == 0) {
            local_b8 = 0;
            bVar43 = false;
          }
          else {
            iVar17 = whereLoopAddVirtualOne
                               (pBuilder,mPrereq,0xffffffffffffffff,1,pIdxInfo,mNoOmit,&bIn,
                                (int *)0x0);
            local_b8 = p->prereq & uVar42;
            bVar43 = local_b8 == 0;
            if (iVar17 != 0) goto LAB_0019af6a;
          }
          uVar24 = 0;
          bVar16 = bVar43;
          do {
            if ((int)uVar40 < 1) {
LAB_0019aef5:
              iVar17 = 0;
              if ((!bVar43) &&
                 (iVar17 = whereLoopAddVirtualOne
                                     (pBuilder,mPrereq,mPrereq,0,pIdxInfo,mNoOmit,&bIn,(int *)0x0),
                 bIn == 0)) {
                bVar16 = true;
              }
              if (!bVar16 && iVar17 == 0) {
                iVar17 = whereLoopAddVirtualOne
                                   (pBuilder,mPrereq,mPrereq,1,pIdxInfo,mNoOmit,&bIn,(int *)0x0);
              }
              break;
            }
            uVar25 = 0xffffffffffffffff;
            uVar28 = 0;
            do {
              iVar17 = pIdxInfo->aConstraint[uVar28].iTermOffset;
              pWVar19 = pWVar10;
              iVar27 = pWVar10->nTerm;
              if (pWVar10->nTerm <= iVar17) {
                do {
                  iVar17 = iVar17 - iVar27;
                  pWVar19 = pWVar19->pOuter;
                  iVar27 = pWVar19->nTerm;
                } while (iVar27 <= iVar17);
              }
              uVar35 = pWVar19->a[iVar17].prereqRight & uVar42;
              uVar33 = uVar25;
              if (uVar35 < uVar25) {
                uVar33 = uVar35;
              }
              if (uVar24 < uVar35) {
                uVar25 = uVar33;
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar40);
            if (uVar25 == 0xffffffffffffffff) goto LAB_0019aef5;
            iVar17 = 0;
            if ((((uVar25 != uVar32) && (uVar25 != local_b8)) &&
                (iVar17 = whereLoopAddVirtualOne
                                    (pBuilder,mPrereq,uVar25 | mPrereq,0,pIdxInfo,mNoOmit,&bIn,
                                     (int *)0x0), p->prereq == mPrereq)) &&
               (bVar43 = true, bIn == 0)) {
              bVar16 = true;
            }
            uVar24 = uVar25;
          } while (iVar17 == 0);
        }
      }
LAB_0019af6a:
      freeIndexInfo(pParse->db,pIdxInfo);
      goto LAB_0019af7c;
    }
    freeIndexInfo(pParse->db,pIdxInfo);
  }
  iVar17 = 7;
LAB_0019af7c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar17;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  SrcItem *pSrc;               /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;
  int bRetry = 0;              /* True to retry with LIMIT/OFFSET disabled */

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pSTab) );
  p = allocateIndexInfo(pWInfo, pWC, mUnusable, pSrc, &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    freeIndexInfo(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pSTab->zName));
  WHERETRACE(0x800, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(
      pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, &bRetry
  );
  if( bRetry ){
    assert( rc==SQLITE_OK );
    rc = whereLoopAddVirtualOne(
        pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn, 0
    );
  }

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x800, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn, 0);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq)
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        int iTerm = p->aConstraint[i].iTermOffset;
        Bitmask mThis = termFromWhereClause(pWC, iTerm)->prereqRight & ~mPrereq;
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x800, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn, 0);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x800, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn, 0);
    }
  }

  freeIndexInfo(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pSTab->zName, rc));
  return rc;
}